

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_memory_access_properties_t val)

{
  ostream *poVar1;
  string *in_RDI;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  string local_48 [55];
  undefined1 local_11;
  string *str;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator+=(in_RDI,"ze_device_memory_access_properties_t.stype : ");
  to_string_abi_cxx11_((ze_structure_type_t)local_48);
  std::__cxx11::string::operator+=(in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"ze_device_memory_access_properties_t.pNext : ");
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(local_1c0,"0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  std::ostream::operator<<(poVar1,val._0_8_);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=(in_RDI,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=
            (in_RDI,"ze_device_memory_access_properties_t.hostAllocCapabilities : ");
  to_string_abi_cxx11_((ze_memory_access_cap_flag_t)local_210);
  std::__cxx11::string::operator+=(in_RDI,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=
            (in_RDI,"ze_device_memory_access_properties_t.deviceAllocCapabilities : ");
  to_string_abi_cxx11_((ze_memory_access_cap_flag_t)local_230);
  std::__cxx11::string::operator+=(in_RDI,local_230);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=
            (in_RDI,"ze_device_memory_access_properties_t.sharedSingleDeviceAllocCapabilities : ");
  to_string_abi_cxx11_((ze_memory_access_cap_flag_t)local_250);
  std::__cxx11::string::operator+=(in_RDI,local_250);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=
            (in_RDI,"ze_device_memory_access_properties_t.sharedCrossDeviceAllocCapabilities : ");
  to_string_abi_cxx11_((ze_memory_access_cap_flag_t)local_270);
  std::__cxx11::string::operator+=(in_RDI,local_270);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=
            (in_RDI,"ze_device_memory_access_properties_t.sharedSystemAllocCapabilities : ");
  to_string_abi_cxx11_((ze_memory_access_cap_flag_t)local_290);
  std::__cxx11::string::operator+=(in_RDI,local_290);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  return in_RDI;
}

Assistant:

std::string to_string( ze_device_memory_access_properties_t val )
{
    std::string str;
    
    str += "ze_device_memory_access_properties_t.stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.hostAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.hostAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.deviceAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.deviceAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.sharedSingleDeviceAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.sharedSingleDeviceAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.sharedCrossDeviceAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.sharedCrossDeviceAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.sharedSystemAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.sharedSystemAllocCapabilities);
    str += "\n";

    return str;
}